

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proposal.cpp
# Opt level: O3

int __thiscall
ncnn::Proposal::forward
          (Proposal *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs)

{
  pointer pMVar1;
  pointer pfVar2;
  float fVar3;
  undefined4 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined4 uVar7;
  size_t sVar8;
  pointer pMVar9;
  int *piVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [12];
  bool bVar14;
  int iVar15;
  uint uVar16;
  void *pvVar17;
  undefined8 *puVar18;
  long lVar19;
  ulong uVar20;
  float *pfVar21;
  uint uVar22;
  uint uVar23;
  long lVar24;
  long lVar25;
  Rect *pRVar26;
  ulong uVar27;
  ulong uVar28;
  void *pvVar29;
  size_t sVar30;
  void *pvVar31;
  void *pvVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float in_XMM5_Db;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  vector<int,_std::allocator<int>_> picked;
  vector<ncnn::Rect,_std::allocator<ncnn::Rect>_> proposal_boxes;
  vector<float,_std::allocator<float>_> scores;
  vector<float,_std::allocator<float>_> areas;
  int local_23c;
  undefined1 local_238 [8];
  undefined8 uStack_230;
  int *local_228;
  vector<ncnn::Rect,_std::allocator<ncnn::Rect>_> local_218;
  undefined1 local_1f8 [16];
  vector<float,_std::allocator<float>_> local_1e8;
  pointer local_1c8;
  ulong local_1c0;
  ulong local_1b8;
  ulong local_1b0;
  ulong local_1a8;
  long local_1a0;
  ulong local_198;
  float local_18c;
  float local_188;
  float local_184;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_180;
  void *local_178;
  void *local_170;
  void *local_168;
  void *local_160;
  long local_158;
  void *local_150;
  ulong local_148;
  ulong local_140;
  vector<float,_std::allocator<float>_> local_138;
  undefined8 local_120;
  int local_118;
  undefined4 local_114;
  ulong local_110;
  long local_108;
  long local_100;
  ulong local_f8;
  long local_f0;
  long local_e8;
  long local_e0;
  ulong local_d8;
  ulong local_d0;
  ulong local_c8;
  int *piStack_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  uint local_a8;
  int local_a4;
  ulong local_a0;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  undefined8 local_78;
  undefined8 uStack_70;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  undefined1 local_48 [24];
  
  local_1c8 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
  local_148 = (ulong)local_1c8->w;
  local_140 = (ulong)(uint)local_1c8->h;
  iVar15 = (this->anchors).h;
  lVar25 = (long)iVar15;
  local_a8 = local_1c8->h * local_1c8->w;
  local_1b0 = (ulong)local_a8;
  local_c8 = 0;
  piStack_c0 = (int *)0x0;
  local_b8 = 4;
  local_b0 = 0x400000003;
  local_f8 = (ulong)(int)(local_a8 * 4);
  local_1b8 = local_f8 & 0x3ffffffffffffffc;
  lVar24 = local_1b8 * lVar25;
  local_180 = top_blobs;
  local_a4 = iVar15;
  local_a0 = local_1b8;
  if (lVar24 != 0) {
    pvVar17 = malloc(lVar24 * 4 + 0x1c);
    local_c8 = (long)pvVar17 + 0x17U & 0xfffffffffffffff0;
    *(void **)(local_c8 - 8) = pvVar17;
    piStack_c0 = (int *)(local_c8 + lVar24 * 4);
    *piStack_c0 = 1;
  }
  local_198 = local_1b0 & 0xffffffff;
  local_1c0 = local_c8;
  local_158 = lVar25;
  if (iVar15 < 1) {
    puVar18 = (undefined8 *)local_1c8[2].data;
  }
  else {
    uVar27 = local_148 & 0xffffffff;
    lVar24 = local_1c8[1].cstep * local_1c8[1].elemsize;
    local_168 = local_1c8[1].data;
    local_1b8 = local_1b8 << 2;
    local_150 = (this->anchors).data;
    local_108 = (long)(this->anchors).w;
    local_18c = (float)this->feat_stride;
    local_e0 = local_148 << 4;
    local_170 = (void *)(lVar24 * 3 + (long)local_168);
    local_100 = lVar24 * 4;
    local_e8 = local_148 * 4;
    local_178 = (void *)((long)local_168 + lVar24 * 2);
    local_160 = (void *)(lVar24 + (long)local_168);
    local_1a0 = 0;
    local_1a8 = local_c8;
    do {
      if (0 < (int)local_140) {
        local_f0 = local_1a0 * local_108;
        uVar5 = *(undefined8 *)((long)local_150 + local_f0 * 4);
        uVar6 = *(undefined8 *)((long)local_150 + local_f0 * 4 + 8);
        fVar37 = (float)uVar6 - (float)uVar5;
        fVar41 = (float)((ulong)uVar5 >> 0x20);
        fVar38 = (float)((ulong)uVar6 >> 0x20) - fVar41;
        fStack_80 = fVar37 * 0.5;
        fStack_7c = fVar38 * 0.5;
        local_188 = (float)this->feat_stride;
        uVar20 = 0;
        local_78 = CONCAT44(fVar38,fVar37);
        uStack_70 = 0;
        pvVar17 = local_170;
        uVar28 = local_1a8;
        pvVar29 = local_160;
        pvVar31 = local_168;
        pvVar32 = local_178;
        fVar43 = fVar41;
        fVar39 = fVar41;
        fVar36 = fVar41;
        local_98 = fVar38;
        fStack_94 = fVar38;
        fStack_90 = fVar38;
        fStack_8c = fVar38;
        fStack_84 = in_XMM5_Db;
        do {
          local_d8 = uVar20;
          if (0 < (int)local_148) {
            fVar40 = *(float *)((long)local_150 + local_f0 * 4);
            local_1f8._4_4_ = 0;
            local_1f8._8_4_ = 0;
            local_1f8._12_4_ = 0;
            lVar24 = 0;
            local_d0 = uVar28;
            local_68 = fVar41;
            fStack_64 = fVar43;
            fStack_60 = fVar39;
            fStack_5c = fVar36;
            do {
              local_1f8._0_4_ = fVar40;
              local_184 = *(float *)((long)pvVar17 + lVar24);
              local_48._0_4_ = (*(float *)((long)pvVar29 + lVar24) + 0.5) * fVar38;
              local_48._4_4_ = 0;
              local_48._8_4_ = (*(float *)((long)pvVar31 + lVar24) + 0.5) * fVar37;
              local_48._12_4_ = 0;
              local_58 = expf(*(float *)((long)pvVar32 + lVar24));
              fVar37 = expf(local_184);
              fVar41 = (float)local_48._8_4_ + (float)local_1f8._0_4_;
              fVar43 = (float)local_48._0_4_ + local_68;
              fVar38 = local_58 * fStack_80;
              fVar37 = fVar37 * fStack_7c;
              auVar35._4_4_ = fVar37;
              auVar35._0_4_ = fVar38;
              auVar35._8_4_ = fVar41;
              auVar35._12_4_ = fVar43;
              auVar13._4_8_ = auVar35._8_8_;
              auVar13._0_4_ = fVar37 + local_68 * fStack_84;
              auVar33._0_8_ = auVar13._0_8_ << 0x20;
              auVar33._8_4_ = fVar41 + fVar38;
              auVar33._12_4_ = fVar43 + fVar37;
              puVar18 = (undefined8 *)(local_d0 + lVar24 * 4);
              *puVar18 = CONCAT44(fVar43 - fVar37,fVar41 - fVar38);
              puVar18[1] = auVar33._8_8_;
              fVar40 = (float)local_1f8._0_4_ + local_188;
              lVar24 = lVar24 + 4;
              uVar28 = local_d0;
              fVar37 = (float)local_78;
              in_XMM5_Db = fStack_84;
              fVar38 = local_98;
              fVar41 = local_68;
              fVar43 = fStack_64;
              fVar39 = fStack_60;
              fVar36 = fStack_5c;
            } while (uVar27 << 2 != lVar24);
          }
          fVar41 = fVar41 + local_18c;
          uVar20 = local_d8 + 1;
          uVar28 = uVar28 + local_e0;
          pvVar17 = (void *)((long)pvVar17 + local_e8);
          pvVar32 = (void *)((long)pvVar32 + local_e8);
          pvVar29 = (void *)((long)pvVar29 + local_e8);
          pvVar31 = (void *)((long)pvVar31 + local_e8);
        } while (uVar20 != local_140);
      }
      local_1a0 = local_1a0 + 1;
      local_1a8 = local_1a8 + local_1b8;
      local_170 = (void *)((long)local_170 + local_100);
      local_178 = (void *)((long)local_178 + local_100);
      local_160 = (void *)((long)local_160 + local_100);
      local_168 = (void *)((long)local_168 + local_100);
    } while (local_1a0 != local_158);
    puVar18 = (undefined8 *)local_1c8[2].data;
    if (0 < (int)local_158) {
      fVar37 = (float)*puVar18;
      fVar38 = (float)((ulong)*puVar18 >> 0x20);
      auVar34._0_4_ = fVar38 + -1.0;
      auVar34._4_4_ = fVar37 + -1.0;
      auVar34._8_4_ = fVar38 + -1.0;
      auVar34._12_4_ = fVar37 + -1.0;
      lVar24 = 0;
      uVar27 = local_1c0;
      do {
        if (0 < (int)local_1b0) {
          lVar25 = 0;
          do {
            auVar35 = minps(*(undefined1 (*) [16])(uVar27 + lVar25),auVar34);
            auVar35 = maxps(auVar35,ZEXT816(0));
            *(undefined1 (*) [16])(uVar27 + lVar25) = auVar35;
            lVar25 = lVar25 + 0x10;
          } while (local_198 << 4 != lVar25);
        }
        lVar24 = lVar24 + 1;
        uVar27 = uVar27 + local_1b8;
      } while (lVar24 != local_158);
    }
  }
  local_218.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
  super__Vector_impl_data._M_start = (Rect *)0x0;
  local_218.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
  super__Vector_impl_data._M_finish = (Rect *)0x0;
  local_218.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (Rect *)0x0;
  local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (float *)0x0;
  local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (float *)0x0;
  local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (float *)0x0;
  if (0 < (int)local_158) {
    local_1f8._0_4_ = (float)this->min_size * *(float *)(puVar18 + 1);
    local_198 = local_198 << 2;
    lVar25 = 0;
    lVar24 = local_158;
    do {
      pfVar2 = (pointer)(local_1c0 + lVar25 * local_f8 * 4);
      local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x4;
      local_120 = 0x400000002;
      local_118 = (int)local_1b0;
      local_114 = 1;
      local_110 = local_f8;
      local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = pfVar2;
      if (0 < local_118) {
        sVar30 = local_1c8->elemsize;
        sVar8 = local_1c8->cstep;
        pvVar17 = local_1c8->data;
        uVar27 = 0;
        do {
          lVar19 = (long)(int)uVar27;
          fVar37 = pfVar2[lVar19];
          if (((float)local_1f8._0_4_ <= (pfVar2[lVar19 + 2] + 1.0) - fVar37) &&
             ((float)local_1f8._0_4_ <= (pfVar2[lVar19 + 3] + 1.0) - pfVar2[lVar19 + 1])) {
            local_238._4_4_ = pfVar2[lVar19 + 1];
            local_238._0_4_ = fVar37;
            uStack_230._0_4_ = pfVar2[lVar19 + 2];
            uStack_230._4_4_ = pfVar2[lVar19 + 3];
            if (local_218.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_218.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<ncnn::Rect,std::allocator<ncnn::Rect>>::
              _M_realloc_insert<ncnn::Rect_const&>
                        ((vector<ncnn::Rect,std::allocator<ncnn::Rect>> *)&local_218,
                         (iterator)
                         local_218.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>.
                         _M_impl.super__Vector_impl_data._M_finish,(Rect *)local_238);
            }
            else {
              (local_218.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
               super__Vector_impl_data._M_finish)->x1 = fVar37;
              (local_218.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
               super__Vector_impl_data._M_finish)->y1 = (float)local_238._4_4_;
              (local_218.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
               super__Vector_impl_data._M_finish)->x2 = (float)uStack_230;
              (local_218.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
               super__Vector_impl_data._M_finish)->y2 = uStack_230._4_4_;
              local_218.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_218.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            pfVar21 = (float *)((long)pvVar17 + uVar27 + sVar30 * sVar8 * lVar24);
            if (local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                        ((vector<float,std::allocator<float>> *)&local_1e8,
                         (iterator)
                         local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_finish,pfVar21);
            }
            else {
              *local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish = *pfVar21;
              local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
          }
          uVar27 = uVar27 + 4;
        } while (local_198 != uVar27);
      }
      lVar25 = lVar25 + 1;
      lVar24 = lVar24 + 1;
    } while (lVar25 != local_158);
    if ((local_218.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
         super__Vector_impl_data._M_start !=
         local_218.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
         super__Vector_impl_data._M_finish) &&
       (local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish)) {
      qsort_descent_inplace<ncnn::Rect>
                (&local_218,&local_1e8,0,
                 (int)((ulong)((long)local_1e8.super__Vector_base<float,_std::allocator<float>_>.
                                     _M_impl.super__Vector_impl_data._M_finish -
                              (long)local_1e8.super__Vector_base<float,_std::allocator<float>_>.
                                    _M_impl.super__Vector_impl_data._M_start) >> 2) + -1);
    }
  }
  iVar15 = this->pre_nms_topN;
  if ((0 < (long)iVar15) &&
     (iVar15 < (int)((ulong)((long)local_218.
                                   super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                            (long)local_218.
                                  super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>.
                                  _M_impl.super__Vector_impl_data._M_start) >> 4))) {
    std::vector<ncnn::Rect,_std::allocator<ncnn::Rect>_>::resize(&local_218,(long)iVar15);
    std::vector<float,_std::allocator<float>_>::resize(&local_1e8,(long)this->pre_nms_topN);
  }
  local_238 = (undefined1  [8])0x0;
  uStack_230 = (int *)0x0;
  local_228 = (int *)0x0;
  local_1f8._0_4_ = this->nms_thresh;
  uVar23 = (uint)((ulong)((long)local_218.
                                super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)local_218.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 4);
  std::vector<float,_std::allocator<float>_>::vector
            (&local_138,(long)(int)uVar23,(allocator_type *)&local_23c);
  if (0 < (int)uVar23) {
    pfVar21 = &(local_218.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                super__Vector_impl_data._M_start)->x2;
    uVar27 = 0;
    do {
      uVar4 = ((Rect *)(pfVar21 + -2))->x1;
      uVar7 = ((Rect *)(pfVar21 + -2))->y1;
      local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar27] =
           ((float)((ulong)*(undefined8 *)pfVar21 >> 0x20) - (float)uVar7) *
           ((float)*(undefined8 *)pfVar21 - (float)uVar4);
      uVar27 = uVar27 + 1;
      pfVar21 = pfVar21 + 4;
    } while ((uVar23 & 0x7fffffff) != uVar27);
    local_23c = 0;
    do {
      uVar22 = (uint)((ulong)((long)uStack_230 - (long)local_238) >> 2);
      if ((int)uVar22 < 1) {
LAB_00112d72:
        if (uStack_230 == local_228) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)local_238,uStack_230,&local_23c);
        }
        else {
          *uStack_230 = local_23c;
          uStack_230 = uStack_230 + 1;
        }
      }
      else {
        lVar24 = (long)local_23c;
        fVar37 = local_218.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar24].x1;
        bVar14 = true;
        uVar27 = 0;
        do {
          iVar15 = *(int *)((long)local_238 + uVar27 * 4);
          fVar38 = local_218.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar15].x2;
          fVar41 = 0.0;
          if (fVar37 <= fVar38) {
            pRVar26 = local_218.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                      super__Vector_impl_data._M_start + iVar15;
            fVar43 = local_218.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar24].x2;
            fVar39 = pRVar26->x1;
            if (fVar39 <= fVar43) {
              fVar36 = local_218.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl
                       .super__Vector_impl_data._M_start[lVar24].y1;
              fVar40 = pRVar26->y2;
              if (fVar36 <= fVar40) {
                fVar3 = local_218.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>.
                        _M_impl.super__Vector_impl_data._M_start[lVar24].y2;
                fVar42 = pRVar26->y1;
                if (fVar42 <= fVar3) {
                  if (fVar43 <= fVar38) {
                    fVar38 = fVar43;
                  }
                  if (fVar39 <= fVar37) {
                    fVar39 = fVar37;
                  }
                  if (fVar3 <= fVar40) {
                    fVar40 = fVar3;
                  }
                  if (fVar42 <= fVar36) {
                    fVar42 = fVar36;
                  }
                  fVar41 = (fVar40 - fVar42) * (fVar38 - fVar39);
                }
              }
            }
          }
          if ((float)local_1f8._0_4_ <
              fVar41 / ((local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar24] - fVar41) +
                       local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start[iVar15])) {
            bVar14 = false;
          }
          uVar27 = uVar27 + 1;
        } while ((uVar22 & 0x7fffffff) != uVar27);
        if (bVar14) goto LAB_00112d72;
      }
      local_23c = local_23c + 1;
    } while (local_23c < (int)uVar23);
  }
  if (local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_138.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  uVar23 = (uint)((ulong)((long)uStack_230 - (long)local_238) >> 2);
  if (this->after_nms_topN < (int)uVar23) {
    uVar23 = this->after_nms_topN;
  }
  pMVar9 = (local_180->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  auVar35 = ZEXT416(uVar23);
  auVar11._4_4_ = -(uint)(pMVar9->w == 4);
  auVar11._0_4_ = -(uint)(pMVar9->dims == 3);
  auVar11._8_4_ = -(uint)(pMVar9->h == 1);
  auVar11._12_4_ = -(uint)(uVar23 == pMVar9->c);
  iVar15 = movmskps((int)local_180,auVar11);
  if ((iVar15 == 0xf) && (pMVar9->elemsize == 4)) {
    pvVar17 = pMVar9->data;
    if (pvVar17 == (void *)0x0) {
LAB_00112fbe:
      iVar15 = -100;
      goto LAB_00112fc4;
    }
    sVar30 = pMVar9->cstep;
    uVar16 = uVar23;
    uVar22 = uVar23;
  }
  else {
    piVar10 = pMVar9->refcount;
    if (piVar10 != (int *)0x0) {
      LOCK();
      *piVar10 = *piVar10 + -1;
      UNLOCK();
      if ((*piVar10 == 0) && (pMVar9->data != (void *)0x0)) {
        local_1f8 = auVar35;
        free(*(void **)((long)pMVar9->data + -8));
        auVar35 = local_1f8;
      }
    }
    pMVar9->data = (void *)0x0;
    pMVar9->refcount = (int *)0x0;
    sVar30 = 4;
    pMVar9->elemsize = 4;
    pMVar9->dims = 3;
    pMVar9->w = 4;
    pMVar9->h = 1;
    pMVar9->c = uVar23;
    pMVar9->cstep = 4;
    if (uVar23 == 0) goto LAB_00112fbe;
    lVar24 = (long)(int)uVar23 * 0x10;
    local_1f8 = auVar35;
    pvVar29 = malloc(lVar24 + 0x1c);
    uVar22 = local_1f8._0_4_;
    pvVar17 = (void *)((long)pvVar29 + 0x17U & 0xfffffffffffffff0);
    *(void **)((long)pvVar17 - 8) = pvVar29;
    pMVar9->data = pvVar17;
    pMVar9->refcount = (int *)((long)pvVar17 + lVar24);
    *(undefined4 *)((long)pvVar17 + lVar24) = 1;
    uVar16 = pMVar9->c;
  }
  iVar15 = -100;
  if ((long)(int)uVar16 * sVar30 != 0) {
    if (0 < (int)uVar23) {
      pfVar21 = (float *)((long)pvVar17 + 0xc);
      uVar27 = 0;
      do {
        iVar15 = *(int *)((long)local_238 + uVar27 * 4);
        pfVar21[-3] = local_218.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                      super__Vector_impl_data._M_start[iVar15].x1;
        pfVar21[-2] = local_218.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                      super__Vector_impl_data._M_start[iVar15].y1;
        pfVar21[-1] = local_218.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                      super__Vector_impl_data._M_start[iVar15].x2;
        *pfVar21 = local_218.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar15].y2;
        uVar27 = uVar27 + 1;
        pfVar21 = pfVar21 + sVar30;
      } while (uVar23 != uVar27);
    }
    pMVar9 = (local_180->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar24 = (long)(local_180->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)pMVar9 >> 4;
    iVar15 = 0;
    if (1 < (ulong)(lVar24 * -0x5555555555555555)) {
      pMVar1 = pMVar9 + 1;
      auVar12._4_4_ = -(uint)(pMVar9[1].w == 1);
      auVar12._0_4_ = -(uint)(pMVar9[1].dims == 3);
      auVar12._8_4_ = -(uint)(pMVar9[1].h == 1);
      auVar12._12_4_ = -(uint)(uVar22 == pMVar9[1].c);
      iVar15 = movmskps((int)lVar24,auVar12);
      if ((iVar15 == 0xf) && (pMVar9[1].elemsize == 4)) {
        pfVar21 = (float *)pMVar1->data;
        iVar15 = -100;
        if (pfVar21 == (float *)0x0) goto LAB_00112fc4;
        sVar30 = pMVar9[1].cstep;
        uVar22 = uVar23;
      }
      else {
        piVar10 = pMVar9[1].refcount;
        if (piVar10 != (int *)0x0) {
          LOCK();
          *piVar10 = *piVar10 + -1;
          UNLOCK();
          if ((*piVar10 == 0) && (pMVar1->data != (void *)0x0)) {
            free(*(void **)((long)pMVar1->data + -8));
          }
        }
        pMVar1->data = (void *)0x0;
        pMVar1->refcount = (int *)0x0;
        sVar30 = 4;
        pMVar9[1].elemsize = 4;
        pMVar9[1].dims = 3;
        pMVar9[1].w = 1;
        pMVar9[1].h = 1;
        pMVar9[1].c = uVar23;
        pMVar9[1].cstep = 4;
        iVar15 = -100;
        if (uVar23 == 0) goto LAB_00112fc4;
        lVar24 = (long)(int)uVar23;
        pvVar17 = malloc(lVar24 * 0x10 + 0x1c);
        pfVar21 = (float *)((long)pvVar17 + 0x17U & 0xfffffffffffffff0);
        *(void **)(pfVar21 + -2) = pvVar17;
        pMVar9[1].data = pfVar21;
        pMVar9[1].refcount = (int *)(pfVar21 + lVar24 * 4);
        pfVar21[lVar24 * 4] = 1.4013e-45;
        uVar22 = pMVar9[1].c;
      }
      iVar15 = -100;
      if (((long)(int)uVar22 * sVar30 != 0) && (iVar15 = 0, 0 < (int)uVar23)) {
        sVar8 = pMVar9[1].elemsize;
        iVar15 = 0;
        uVar27 = 0;
        do {
          *pfVar21 = local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start[*(int *)((long)local_238 + uVar27 * 4)];
          uVar27 = uVar27 + 1;
          pfVar21 = (float *)((long)pfVar21 + sVar30 * sVar8);
        } while (uVar23 != uVar27);
      }
    }
  }
LAB_00112fc4:
  if (local_238 != (undefined1  [8])0x0) {
    operator_delete((void *)local_238,(long)local_228 - (long)local_238);
  }
  if (local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (float *)0x0) {
    operator_delete(local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_218.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
      super__Vector_impl_data._M_start != (Rect *)0x0) {
    operator_delete(local_218.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_218.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_218.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (piStack_c0 != (int *)0x0) {
    LOCK();
    *piStack_c0 = *piStack_c0 + -1;
    UNLOCK();
    if ((*piStack_c0 == 0) && (local_c8 != 0)) {
      free(*(void **)(local_c8 - 8));
    }
  }
  return iVar15;
}

Assistant:

int Proposal::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs) const
{
    const Mat& score_blob = bottom_blobs[0];
    const Mat& bbox_blob = bottom_blobs[1];
    const Mat& im_info_blob = bottom_blobs[2];

    int w = score_blob.w;
    int h = score_blob.h;

    // generate proposals from bbox deltas and shifted anchors
    const int num_anchors = anchors.h;

    Mat proposals;
    proposals.create(4, w * h, num_anchors);

    #pragma omp parallel for
    for (int q=0; q<num_anchors; q++)
    {
        const float* bbox_xptr = bbox_blob.channel(q * 4);
        const float* bbox_yptr = bbox_blob.channel(q * 4 + 1);
        const float* bbox_wptr = bbox_blob.channel(q * 4 + 2);
        const float* bbox_hptr = bbox_blob.channel(q * 4 + 3);

        Mat pbs = proposals.channel(q);

        const float* anchor = anchors.row(q);

        // shifted anchor
        float anchor_y = anchor[1];

        float anchor_w = anchor[2] - anchor[0];
        float anchor_h = anchor[3] - anchor[1];

        for (int i = 0; i < h; i++)
        {
            float anchor_x = anchor[0];

            for (int j = 0; j < w; j++)
            {
                float* pb = pbs.row(i*w + j);

                // apply center size
                float dx = bbox_xptr[j];
                float dy = bbox_yptr[j];
                float dw = bbox_wptr[j];
                float dh = bbox_hptr[j];

                float cx = anchor_x + anchor_w * 0.5f;
                float cy = anchor_y + anchor_h * 0.5f;

                float pb_cx = cx + anchor_w * dx;
                float pb_cy = cy + anchor_h * dy;

                float pb_w = anchor_w * exp(dw);
                float pb_h = anchor_h * exp(dh);

                pb[0] = pb_cx - pb_w * 0.5f;
                pb[1] = pb_cy - pb_h * 0.5f;
                pb[2] = pb_cx + pb_w * 0.5f;
                pb[3] = pb_cy + pb_h * 0.5f;

                anchor_x += feat_stride;
            }

            bbox_xptr += w;
            bbox_yptr += w;
            bbox_wptr += w;
            bbox_hptr += w;

            anchor_y += feat_stride;
        }
    }

    // clip predicted boxes to image
    float im_w = im_info_blob[1];
    float im_h = im_info_blob[0];

    #pragma omp parallel for
    for (int q=0; q<num_anchors; q++)
    {
        Mat pbs = proposals.channel(q);

        for (int i = 0; i < w * h; i++)
        {
            float* pb = pbs.row(i);

            // clip box
            pb[0] = std::max(std::min(pb[0], im_w - 1), 0.f);
            pb[1] = std::max(std::min(pb[1], im_h - 1), 0.f);
            pb[2] = std::max(std::min(pb[2], im_w - 1), 0.f);
            pb[3] = std::max(std::min(pb[3], im_h - 1), 0.f);
        }
    }

    // remove predicted boxes with either height or width < threshold
    std::vector<Rect> proposal_boxes;
    std::vector<float> scores;

    float im_scale = im_info_blob[2];
    float min_boxsize = min_size * im_scale;

    for (int q=0; q<num_anchors; q++)
    {
        Mat pbs = proposals.channel(q);
        const float* scoreptr = score_blob.channel(q + num_anchors);

        for (int i = 0; i < w * h; i++)
        {
            float* pb = pbs.row(i);

            float pb_w = pb[2] - pb[0] + 1;
            float pb_h = pb[3] - pb[1] + 1;

            if (pb_w >= min_boxsize && pb_h >= min_boxsize)
            {
                Rect r = { pb[0], pb[1], pb[2], pb[3] };
                proposal_boxes.push_back(r);
                scores.push_back(scoreptr[i]);
            }
        }
    }

    // sort all (proposal, score) pairs by score from highest to lowest
    qsort_descent_inplace(proposal_boxes, scores);

    // take top pre_nms_topN
    if (pre_nms_topN > 0 && pre_nms_topN < (int)proposal_boxes.size())
    {
        proposal_boxes.resize(pre_nms_topN);
        scores.resize(pre_nms_topN);
    }

    // apply nms with nms_thresh
    std::vector<int> picked;
    nms_sorted_bboxes(proposal_boxes, picked, nms_thresh);

    // take after_nms_topN
    int picked_count = std::min((int)picked.size(), after_nms_topN);

    // return the top proposals
    Mat& roi_blob = top_blobs[0];
    roi_blob.create(4, 1, picked_count);
    if (roi_blob.empty())
        return -100;

    for (int i=0; i<picked_count; i++)
    {
        float* outptr = roi_blob.channel(i);

        outptr[0] = proposal_boxes[ picked[i] ].x1;
        outptr[1] = proposal_boxes[ picked[i] ].y1;
        outptr[2] = proposal_boxes[ picked[i] ].x2;
        outptr[3] = proposal_boxes[ picked[i] ].y2;
    }

    if (top_blobs.size() > 1)
    {
        Mat& roi_score_blob = top_blobs[1];
        roi_score_blob.create(1, 1, picked_count);
        if (roi_score_blob.empty())
            return -100;

        for (int i=0; i<picked_count; i++)
        {
            float* outptr = roi_score_blob.channel(i);
            outptr[0] = scores[ picked[i] ];
        }
    }

    return 0;
}